

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O2

void sysbvm_jit_makeDictionary
               (sysbvm_bytecodeJit_t *jit,int16_t resultOperand,size_t elementCount,
               int16_t *elementOperands)

{
  sysbvm_x86_register_t reg;
  undefined6 in_register_00000032;
  code *pcVar1;
  size_t i;
  size_t sVar2;
  
  if (-1 < resultOperand) {
    sysbvm_jit_x86_jitLoadContextInRegister
              (jit,(sysbvm_x86_register_t)CONCAT62(in_register_00000032,resultOperand));
    sysbvm_jit_x86_movImmediate32(jit,SYSBVM_X86_64_ARG1,(int32_t)elementCount);
    sysbvm_jit_x86_call(jit,sysbvm_dictionary_createWithCapacity);
    pcVar1 = (code *)(ulong)(uint)(int)resultOperand;
    sysbvm_jit_moveRegisterToOperand(jit,resultOperand,reg);
    for (sVar2 = 0; elementCount != sVar2; sVar2 = sVar2 + 1) {
      sysbvm_jit_x86_jitLoadContextInRegister(jit,(sysbvm_x86_register_t)pcVar1);
      sysbvm_jit_moveOperandToRegister(jit,SYSBVM_X86_64_ARG1,resultOperand);
      sysbvm_jit_moveOperandToRegister(jit,SYSBVM_X86_64_ARG2,elementOperands[sVar2]);
      pcVar1 = sysbvm_dictionary_add;
      sysbvm_jit_x86_call(jit,sysbvm_dictionary_add);
    }
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_jit_makeDictionary(sysbvm_bytecodeJit_t *jit, int16_t resultOperand, size_t elementCount, int16_t *elementOperands)
{
    if(resultOperand < 0)
        return;

    sysbvm_jit_x86_jitLoadContextInRegister(jit, SYSBVM_X86_64_ARG0);
    sysbvm_jit_x86_movImmediate32(jit, SYSBVM_X86_64_ARG1, (int32_t)elementCount);
    sysbvm_jit_x86_call(jit, &sysbvm_dictionary_createWithCapacity);
    sysbvm_jit_moveRegisterToOperand(jit, resultOperand, SYSBVM_X86_RAX);

    for(size_t i = 0; i < elementCount; ++i)
    {
        sysbvm_jit_x86_jitLoadContextInRegister(jit, SYSBVM_X86_64_ARG0);
        sysbvm_jit_moveOperandToRegister(jit, SYSBVM_X86_64_ARG1, resultOperand);
        sysbvm_jit_moveOperandToRegister(jit, SYSBVM_X86_64_ARG2, elementOperands[i]);
        sysbvm_jit_x86_call(jit, &sysbvm_dictionary_add);
    }
}